

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

int __thiscall
CVmObjTimeZone::getp_getHistory(CVmObjTimeZone *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_val_t *pvVar3;
  CVmObject *pCVar4;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmTimeZone *in_RDI;
  CVmObjDate *date;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff78;
  uint *in_stack_ffffffffffffff80;
  vm_val_t *in_stack_ffffffffffffff88;
  CVmObject *local_60;
  int32_t in_stack_ffffffffffffffa8;
  int n;
  int dayno;
  CVmTimeZone *in_stack_ffffffffffffffc0;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  dayno = n;
  if ((getp_getHistory(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getHistory(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getHistory::desc,0,1);
    __cxa_guard_release(&getp_getHistory(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (iVar1 != 0) {
    return 1;
  }
  if ((n == 0) || (pvVar3 = CVmStack::get(0), pvVar3->typ == VM_NIL)) {
    get_tz((CVmObjTimeZone *)0x34acd2);
    vVar2 = CVmTimeZone::get_history_list(in_stack_ffffffffffffffc0);
    vm_val_t::set_obj(in_RDX,vVar2);
    goto LAB_0034ace6;
  }
  pvVar3 = CVmStack::get(0);
  if (pvVar3->typ == VM_OBJ) {
    CVmStack::get(0);
    pCVar4 = vm_objp(0);
    iVar1 = (*pCVar4->_vptr_CVmObject[1])(pCVar4,CVmObjDate::metaclass_reg_);
    if (iVar1 == 0) goto LAB_0034ac4a;
    CVmStack::get(0);
    local_60 = vm_objp(0);
  }
  else {
LAB_0034ac4a:
    local_60 = (CVmObject *)0x0;
  }
  if (local_60 == (CVmObject *)0x0) {
    err_throw(0);
  }
  get_tz((CVmObjTimeZone *)0x34ac83);
  CVmObjDate::get_dayno((CVmObjDate *)0x34ac92);
  CVmObjDate::get_daytime((CVmObjDate *)0x34aca0);
  vVar2 = CVmTimeZone::get_history_item(in_RDI,dayno,in_stack_ffffffffffffffa8);
  vm_val_t::set_obj(in_RDX,vVar2);
LAB_0034ace6:
  CVmStack::discard(n);
  return 1;
}

Assistant:

int CVmObjTimeZone::getp_getHistory(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check for a Date argument */
    if (argc >= 1 && G_stk->get(0)->typ != VM_NIL)
    {
        /* there's a date - retrieve it */
        CVmObjDate *date = vm_val_cast(CVmObjDate, G_stk->get(0));
        if (date == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the history for the given date only */
        retval->set_obj(get_tz()->get_history_item(
            vmg_ date->get_dayno(), date->get_daytime()));
    }
    else
    {
        /* no date argument - get the full history */
        retval->set_obj(get_tz()->get_history_list(vmg0_));
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}